

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

GroupInfo Js::RegexHelper::PrimMatch
                    (RegexMatchState *state,ScriptContext *scriptContext,RegexPattern *pattern,
                    CharCount inputLength,CharCount offset)

{
  code *pcVar1;
  bool bVar2;
  Program **ppPVar3;
  undefined4 *puVar4;
  Matcher **ppMVar5;
  RegexStatsDatabase *pRVar6;
  Matcher *this;
  GroupInfo GVar7;
  DebugWriter *local_40;
  DebugWriter *w;
  RegexStats *stats;
  CharCount offset_local;
  CharCount inputLength_local;
  RegexPattern *pattern_local;
  ScriptContext *scriptContext_local;
  RegexMatchState *state_local;
  
  ppPVar3 = Memory::WriteBarrierPtr::operator_cast_to_Program__
                      ((WriteBarrierPtr *)&(pattern->rep).unified);
  if (*ppPVar3 == (Program *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x784,"(pattern->rep.unified.program != 0)",
                                "pattern->rep.unified.program != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppMVar5 = Memory::WriteBarrierPtr::operator_cast_to_Matcher__
                      ((WriteBarrierPtr *)&(pattern->rep).unified.matcher);
  if (*ppMVar5 == (Matcher *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x785,"(pattern->rep.unified.matcher != 0)",
                                "pattern->rep.unified.matcher != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  w = (DebugWriter *)0x0;
  if ((DAT_01ec73d9 & 1) != 0) {
    pRVar6 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    w = (DebugWriter *)UnifiedRegex::RegexStatsDatabase::GetRegexStats(pRVar6,pattern);
    pRVar6 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    UnifiedRegex::RegexStatsDatabase::BeginProfile(pRVar6);
  }
  local_40 = (DebugWriter *)0x0;
  if (((DAT_01ec73d8 & 1) != 0) && ((DAT_01ec73ca & 1) != 0)) {
    local_40 = ScriptContext::GetRegexDebugWriter(scriptContext);
  }
  this = Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator->(&(pattern->rep).unified.matcher)
  ;
  UnifiedRegex::Matcher::Match
            (this,state->input,inputLength,offset,scriptContext,(RegexStats *)w,local_40);
  if ((DAT_01ec73d9 & 1) != 0) {
    pRVar6 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    UnifiedRegex::RegexStatsDatabase::EndProfile(pRVar6,(RegexStats *)w,Execute);
  }
  GVar7 = UnifiedRegex::RegexPattern::GetGroup(pattern,0);
  return GVar7;
}

Assistant:

UnifiedRegex::GroupInfo
    RegexHelper::PrimMatch(RegexMatchState& state, ScriptContext* scriptContext, UnifiedRegex::RegexPattern* pattern, CharCount inputLength, CharCount offset)
    {
        Assert(pattern->rep.unified.program != 0);
        Assert(pattern->rep.unified.matcher != 0);
#if ENABLE_REGEX_CONFIG_OPTIONS
        UnifiedRegex::RegexStats* stats = 0;
        if (REGEX_CONFIG_FLAG(RegexProfile))
        {
            stats = scriptContext->GetRegexStatsDatabase()->GetRegexStats(pattern);
            scriptContext->GetRegexStatsDatabase()->BeginProfile();
        }
        UnifiedRegex::DebugWriter* w = 0;
        if (REGEX_CONFIG_FLAG(RegexTracing) && CONFIG_FLAG(Verbose))
            w = scriptContext->GetRegexDebugWriter();
#endif

        pattern->rep.unified.matcher->Match
            (state.input
                , inputLength
                , offset
                , scriptContext
#if ENABLE_REGEX_CONFIG_OPTIONS
                , stats
                , w
#endif
                );

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexProfile))
            scriptContext->GetRegexStatsDatabase()->EndProfile(stats, UnifiedRegex::RegexStats::Execute);
#endif
        return pattern->GetGroup(0);
    }